

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::LoadPeriodToWeighting(void)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  size_t local_28;
  size_t i;
  undefined1 auStack_18 [4];
  Periods p;
  FILE *fin;
  
  p.weighting = (double)fopen("input/periods.bin","rb");
  if ((FILE *)p.weighting != (FILE *)0x0) {
    local_28 = fread((void *)((long)&i + 4),0xc,1,(FILE *)p.weighting);
    while (mVar1 = _auStack_18, local_28 != 0) {
      pmVar2 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)periodToWeighting_,(key_type *)((long)&i + 4));
      *pmVar2 = mVar1;
      local_28 = fread((void *)((long)&i + 4),0xc,1,(FILE *)p.weighting);
    }
  }
  return;
}

Assistant:

void LoadPeriodToWeighting() {

    FILE* fin = fopen(PERIODS_FILE, "rb");
    if (fin == nullptr) return;

    Periods p;
    size_t i = fread(&p, sizeof(Periods), 1, fin);
    while (i != 0) {
      periodToWeighting_[p.period_no] = p.weighting;
      i = fread(&p, sizeof(Periods), 1, fin);
    }

  }